

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxIntCast::Resolve(FxIntCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FxConstant *pFVar4;
  long lVar5;
  FxExpression *x;
  ExpVal constval;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar2 = (*this->basex->_vptr_FxExpression[2])();
      pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
      this->basex = pFVar3;
      if (pFVar3 != (FxExpression *)0x0) {
        iVar2 = (*(pFVar3->ValueType->super_DObject)._vptr_DObject[0x12])();
        pFVar4 = (FxConstant *)this->basex;
        pPVar1 = (pFVar4->super_FxExpression).ValueType;
        if (iVar2 == 0) {
          if (pPVar1 == (PType *)TypeName) {
            iVar2 = (*(pFVar4->super_FxExpression)._vptr_FxExpression[3])(pFVar4);
            if ((char)iVar2 == '\0') {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got a name");
            }
            else {
              ExpVal::ExpVal(&constval,(ExpVal *)(this->basex + 1));
              lVar5 = (long)constval.field_1.Int;
              if (constval.Type != (PType *)TypeName) {
                lVar5 = 0;
              }
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got \"%s\"",FName::NameData.NameArray[lVar5].Text);
              ExpVal::~ExpVal(&constval);
            }
            pFVar4 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant(pFVar4,0,&(this->super_FxExpression).ScriptPosition);
          }
          else {
            this->basex = (FxExpression *)0x0;
          }
        }
        else {
          iVar2 = (**(code **)(*(long *)&pPVar1->super_DObject + 0x90))();
          if (iVar2 == 1) {
            iVar2 = (*this->basex->_vptr_FxExpression[3])();
            if ((char)iVar2 == '\0') {
              return &this->super_FxExpression;
            }
            ExpVal::ExpVal(&constval,(ExpVal *)(this->basex + 1));
            pFVar4 = (FxConstant *)operator_new(0x48);
            iVar2 = ExpVal::GetInt(&constval);
            FxConstant::FxConstant(pFVar4,iVar2,&(this->super_FxExpression).ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            ExpVal::~ExpVal(&constval);
            return &pFVar4->super_FxExpression;
          }
          pFVar4 = (FxConstant *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return &pFVar4->super_FxExpression;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxIntCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxIntCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			FxExpression *x = basex;
			basex = NULL;
			delete this;
			return x;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant())	ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression * x = new FxConstant(0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetInt(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return NULL;
}